

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peeps.cpp
# Opt level: O0

Instr * __thiscall
Peeps::PeepCondMove(Peeps *this,LabelInstr *labelInstr,Instr *nextInstr,bool isInHelper)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  Opnd *pOVar4;
  BranchInstr *pBVar5;
  LabelInstr *pLVar6;
  undefined4 *puVar7;
  BranchInstr *brInstr;
  LabelInstr *pLStack_38;
  OpCode newOpCode;
  Instr *instr;
  bool isInHelper_local;
  Instr *nextInstr_local;
  LabelInstr *labelInstr_local;
  Peeps *this_local;
  
  pLStack_38 = (LabelInstr *)IR::Instr::GetPrevRealInstrOrLabel(&labelInstr->super_Instr);
  brInstr._6_2_ = InvalidOpCode;
  while( true ) {
    if ((pLStack_38->super_Instr).m_opcode != MOV) {
      bVar2 = IR::Instr::IsBranchInstr(&pLStack_38->super_Instr);
      this_local = (Peeps *)nextInstr;
      if (bVar2) {
        pBVar5 = IR::Instr::AsBranchInstr(&pLStack_38->super_Instr);
        bVar2 = IR::BranchInstr::IsConditional(pBVar5);
        if (bVar2) {
          pBVar5 = IR::Instr::AsBranchInstr(&pLStack_38->super_Instr);
          bVar2 = IR::BranchInstr::IsMultiBranch(pBVar5);
          if (!bVar2) {
            pBVar5 = IR::Instr::AsBranchInstr(&pLStack_38->super_Instr);
            pLVar6 = IR::BranchInstr::GetTarget(pBVar5);
            if ((pLVar6 == labelInstr) && ((pLStack_38->super_Instr).m_opcode != Leave)) {
              pBVar5 = IR::Instr::AsBranchInstr(&pLStack_38->super_Instr);
              switch(*(int *)&(pBVar5->super_Instr).m_opcode - 0x41dU & 0xffff) {
              case 0:
                brInstr._6_2_ = CMOVBE;
                break;
              case 1:
                brInstr._6_2_ = CMOVB;
                break;
              case 2:
                brInstr._6_2_ = CMOVAE;
                break;
              case 3:
                brInstr._6_2_ = CMOVA;
                break;
              case 4:
                brInstr._6_2_ = CMOVNE;
                break;
              case 5:
                brInstr._6_2_ = CMOVL;
                break;
              case 6:
                brInstr._6_2_ = CMOVLE;
                break;
              case 7:
                brInstr._6_2_ = CMOVG;
                break;
              case 8:
                brInstr._6_2_ = CMOVGE;
                break;
              default:
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar7 = 1;
                bVar2 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                                   ,0x4dd,"((0))","UNREACHED");
                if (!bVar2) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar7 = 0;
                break;
              case 10:
                brInstr._6_2_ = CMOVE;
                break;
              case 0xb:
                brInstr._6_2_ = CMOVO;
                break;
              case 0xc:
                brInstr._6_2_ = CMOVP;
                break;
              case 0xd:
                brInstr._6_2_ = CMOVS;
                break;
              case 0xe:
                brInstr._6_2_ = CMOVNO;
                break;
              case 0xf:
                brInstr._6_2_ = CMOVNP;
                break;
              case 0x10:
                brInstr._6_2_ = CMOVNS;
              }
              for (pLStack_38 = (LabelInstr *)
                                IR::Instr::GetNextRealInstrOrLabel(&pBVar5->super_Instr);
                  pLStack_38 != labelInstr;
                  pLStack_38 = (LabelInstr *)
                               IR::Instr::GetNextRealInstrOrLabel(&pLStack_38->super_Instr)) {
                (pLStack_38->super_Instr).m_opcode = brInstr._6_2_;
              }
              IR::Instr::Remove(&pBVar5->super_Instr);
              BVar3 = IR::LabelInstr::IsUnreferenced(labelInstr);
              if (BVar3 != 0) {
                this_local = (Peeps *)PeepUnreachableLabel(labelInstr,isInHelper,(bool *)0x0);
              }
            }
          }
        }
      }
      return (Instr *)this_local;
    }
    pOVar4 = IR::Instr::GetSrc1(&pLStack_38->super_Instr);
    bVar2 = IR::Opnd::IsRegOpnd(pOVar4);
    if (!bVar2) {
      return nextInstr;
    }
    pOVar4 = IR::Instr::GetDst(&pLStack_38->super_Instr);
    bVar2 = IR::Opnd::IsRegOpnd(pOVar4);
    if (!bVar2) break;
    pLStack_38 = (LabelInstr *)IR::Instr::GetPrevRealInstrOrLabel(&pLStack_38->super_Instr);
  }
  return nextInstr;
}

Assistant:

IR::Instr*
Peeps::PeepCondMove(IR::LabelInstr *labelInstr, IR::Instr *nextInstr, const bool isInHelper)
{
    IR::Instr *instr = labelInstr->GetPrevRealInstrOrLabel();

    Js::OpCode newOpCode = Js::OpCode::InvalidOpCode;

    // Check if BB is all MOVs with both RegOpnd
    while(instr->m_opcode == Js::OpCode::MOV)
    {
        if (!instr->GetSrc1()->IsRegOpnd() || !instr->GetDst()->IsRegOpnd())
            return nextInstr;
        instr = instr->GetPrevRealInstrOrLabel();
    }

    // Did we hit a conditional branch ?
    if (instr->IsBranchInstr() && instr->AsBranchInstr()->IsConditional() &&
        !instr->AsBranchInstr()->IsMultiBranch() &&
        instr->AsBranchInstr()->GetTarget() == labelInstr &&
        instr->m_opcode != Js::OpCode::Leave)
    {
        IR::BranchInstr *brInstr = instr->AsBranchInstr();

        // Get the correct CMOVcc
        switch(brInstr->m_opcode)
        {
        case Js::OpCode::JA:
                newOpCode = Js::OpCode::CMOVBE;
                break;
        case Js::OpCode::JAE:
                newOpCode = Js::OpCode::CMOVB;
                break;
        case Js::OpCode::JB:
                newOpCode = Js::OpCode::CMOVAE;
                break;
        case Js::OpCode::JBE:
                newOpCode = Js::OpCode::CMOVA;
                break;
        case Js::OpCode::JEQ:
                newOpCode = Js::OpCode::CMOVNE;
                break;
        case Js::OpCode::JNE:
                newOpCode = Js::OpCode::CMOVE;
                break;
        case Js::OpCode::JNP:
                newOpCode = Js::OpCode::CMOVP;
                break;
        case Js::OpCode::JLT:
                newOpCode = Js::OpCode::CMOVGE;
                break;
        case Js::OpCode::JLE:
                newOpCode = Js::OpCode::CMOVG;
                break;
        case Js::OpCode::JGT:
                newOpCode = Js::OpCode::CMOVLE;
                break;
        case Js::OpCode::JGE:
                newOpCode = Js::OpCode::CMOVL;
                break;
        case Js::OpCode::JNO:
                newOpCode = Js::OpCode::CMOVO;
                break;
        case Js::OpCode::JO:
                newOpCode = Js::OpCode::CMOVNO;
                break;
        case Js::OpCode::JP:
                newOpCode = Js::OpCode::CMOVNP;
                break;
        case Js::OpCode::JNSB:
                newOpCode = Js::OpCode::CMOVS;
                break;
        case Js::OpCode::JSB:
                newOpCode = Js::OpCode::CMOVNS;
                break;
        default:
                Assert(UNREACHED);
                __assume(UNREACHED);
        }

        // convert the entire block to CMOVs
        instr = brInstr->GetNextRealInstrOrLabel();
        while(instr != labelInstr)
        {
            instr->m_opcode = newOpCode;
            instr = instr->GetNextRealInstrOrLabel();
        }

        // remove the Jcc
        brInstr->Remove();
        // We may have exposed an unreachable label by deleting the branch
        if (labelInstr->IsUnreferenced())
           return Peeps::PeepUnreachableLabel(labelInstr, isInHelper);
    }
    return nextInstr;
}